

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueueExample.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  thread t2;
  thread t1;
  MPMCQueue<int> q;
  long *local_158;
  thread local_150;
  thread local_148;
  Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> local_140;
  
  rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::Queue
            (&local_140,10,(allocator<rigtorp::mpmc::Slot<int>_> *)&local_158);
  local_148._M_id._M_thread = (id)0;
  local_158 = (long *)operator_new(0x10);
  *local_158 = (long)&PTR___State_00104d20;
  local_158[1] = (long)&local_140;
  std::thread::_M_start_thread(&local_148,&local_158,0);
  if (local_158 != (long *)0x0) {
    (**(code **)(*local_158 + 8))();
  }
  local_150._M_id._M_thread = (id)0;
  local_158 = (long *)operator_new(0x10);
  *local_158 = (long)&PTR___State_00104d60;
  local_158[1] = (long)&local_140;
  std::thread::_M_start_thread(&local_150,&local_158,0);
  if (local_158 != (long *)0x0) {
    (**(code **)(*local_158 + 8))();
  }
  local_158._0_4_ = 1;
  rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::emplace<int>
            (&local_140,(int *)&local_158);
  local_158 = (long *)CONCAT44(local_158._4_4_,2);
  rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::emplace<int>
            (&local_140,(int *)&local_158);
  std::thread::join();
  std::thread::join();
  std::thread::~thread(&local_150);
  std::thread::~thread(&local_148);
  rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::~Queue(&local_140);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  (void)argc, (void)argv;

  using namespace rigtorp;

  MPMCQueue<int> q(10);
  auto t1 = std::thread([&] {
    int v;
    q.pop(v);
    std::cout << "t1 " << v << "\n";
  });
  auto t2 = std::thread([&] {
    int v;
    q.pop(v);
    std::cout << "t2 " << v << "\n";
  });
  q.push(1);
  q.push(2);
  t1.join();
  t2.join();

  return 0;
}